

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Operation::Operation(Operation *this,Operation *from)

{
  string *psVar1;
  ulong uVar2;
  Arena *pAVar3;
  Operation *from_local;
  Operation *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Operation_006eff80;
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::MapFieldLite(&this->inputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::
  RepeatedPtrField(&this->outputs_,&from->outputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::RepeatedPtrField
            (&this->blocks_,&from->blocks_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::MapFieldLite(&this->attributes_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::MergeFrom(&this->inputs_,&from->inputs_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::MergeFrom(&this->attributes_,&from->attributes_);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->type_,psVar1);
  _internal_type_abi_cxx11_(from);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar1 = _internal_type_abi_cxx11_(from);
    pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->type_,psVar1,pAVar3);
  }
  return;
}

Assistant:

Operation::Operation(const Operation& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      outputs_(from.outputs_),
      blocks_(from.blocks_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  inputs_.MergeFrom(from.inputs_);
  attributes_.MergeFrom(from.attributes_);
  type_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    type_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_type().empty()) {
    type_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_type(), 
      GetArenaForAllocation());
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.Operation)
}